

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::FeedRowAndObjNames<mp::StringFileWriter>
          (ExampleNLFeeder *this,StringFileWriter *wrt)

{
  bool bVar1;
  StringFileWriter *in_RSI;
  ExampleNLFeeder *in_RDI;
  int i;
  char *in_stack_ffffffffffffffc8;
  StringFileWriter *in_stack_ffffffffffffffd0;
  int local_14;
  
  bVar1 = mp::StringFileWriter::operator_cast_to_bool(in_stack_ffffffffffffffd0);
  if (bVar1) {
    for (local_14 = 0; Model(in_RDI), local_14 < 3; local_14 = local_14 + 1) {
      in_stack_ffffffffffffffd0 = in_RSI;
      Model(in_RDI);
      mp::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    Model(in_RDI);
    mp::operator<<(in_stack_ffffffffffffffd0,(char *)in_RSI);
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (wrt) {     // && output_desired
      for (int i=0; i<Model().n_con; ++i)
        wrt << Model().con_name[i];
      wrt << Model().obj_name;
    }
  }